

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O2

int SetLidarSpinSpeedRequestRPLIDAR(RPLIDAR *pRPLIDAR,int rpm)

{
  int iVar1;
  uchar reqbuf [6];
  
  reqbuf[5] = '\0';
  reqbuf[3] = (uchar)rpm;
  reqbuf[0] = 0xa5;
  reqbuf[1] = 0xa8;
  reqbuf[2] = '\x02';
  reqbuf[4] = (uchar)((uint)rpm >> 8);
  reqbuf[5] = ComputeChecksumRPLIDAR(reqbuf,6);
  iVar1 = WriteAllRS232Port(&pRPLIDAR->RS232Port,reqbuf,6);
  if (iVar1 != 0) {
    puts("Error writing data to a RPLIDAR. ");
  }
  return (uint)(iVar1 != 0);
}

Assistant:

inline int SetLidarSpinSpeedRequestRPLIDAR(RPLIDAR* pRPLIDAR, int rpm)
{
#ifdef ENABLE_RPLIDAR_SDK_SUPPORT
#ifdef FORCE_RPLIDAR_SDK_V1
#ifdef SLAMTEC_LIDAR_SDK_VERSION
	if (IS_FAIL(pRPLIDAR->drv->setMotorPWM((_u16)rpm)))
	{
		printf("A RPLIDAR is not responding correctly : setMotorPWM() failed. \n");
		return EXIT_FAILURE;
	}
#else
	if (IS_FAIL(pRPLIDAR->drv->setLidarSpinSpeed((_u16)rpm)))
	{
		printf("A RPLIDAR is not responding correctly : setLidarSpinSpeed() failed. \n");
		return EXIT_FAILURE;
	}
#endif // SLAMTEC_LIDAR_SDK_VERSION
#else
	if (SL_IS_FAIL(pRPLIDAR->drv->setMotorSpeed((sl_u16)rpm)))
	{
		printf("A RPLIDAR is not responding correctly : setMotorSpeed() failed. \n");
		return EXIT_FAILURE;
	}
#endif // FORCE_RPLIDAR_SDK_V1
#else
	unsigned char reqbuf[] = {START_FLAG1_RPLIDAR,SET_MOTOR_SPEED_CTRL_REQUEST_RPLIDAR,0x02,0,0,0};

	reqbuf[3] = (unsigned char)rpm;
	reqbuf[4] = (unsigned char)(rpm>>8);
	reqbuf[5] = ComputeChecksumRPLIDAR(reqbuf, sizeof(reqbuf));

	// Send request.
	if (WriteAllRS232Port(&pRPLIDAR->RS232Port, reqbuf, sizeof(reqbuf)) != EXIT_SUCCESS)
	{
		printf("Error writing data to a RPLIDAR. \n");
		return EXIT_FAILURE;
	}
#endif // ENABLE_RPLIDAR_SDK_SUPPORT

	return EXIT_SUCCESS;
}